

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

int ncnn::binary_op_scalar<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
              (Mat *a,float b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar4 [32];
  undefined8 uVar8;
  __m128 afVar9;
  __m128 _p_1;
  __m128 _b;
  __m256 _p;
  __m256 _b_avx;
  int i;
  float *outptr;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_add op;
  Mat *m;
  Mat *m_1;
  __m256 *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  binary_op_add *this;
  float local_400 [2];
  float afStack_3f8 [2];
  float local_3f0 [4];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  int local_384;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined4 local_368;
  long local_360;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined8 local_340;
  float *local_338;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined4 local_308;
  long local_300;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined8 local_2e0;
  float *local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  binary_op_add local_2c1 [9];
  long *local_2b8;
  float local_2ac;
  long *local_2a8;
  undefined1 local_29d;
  int local_29c;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_278;
  binary_op_add *local_268;
  undefined1 local_255;
  int local_254;
  undefined8 *local_248;
  undefined8 *local_238;
  float local_22c;
  float *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  float *local_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float local_1cc;
  float *local_1c8;
  float local_1c0 [2];
  float afStack_1b8 [4];
  float *local_1a8;
  long local_1a0;
  undefined4 local_194;
  long local_190;
  float *local_188;
  undefined4 local_17c;
  int local_178;
  int local_174;
  undefined8 *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  float *local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  undefined4 local_12c;
  long local_128;
  undefined4 local_11c;
  long local_118;
  binary_op_add *local_e8;
  undefined8 *local_c8;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_2c8 = (int)in_RDI[7];
  local_2cc = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_2b8 = in_RSI;
  local_2ac = in_XMM0_Da;
  local_2a8 = in_RDI;
  for (local_2d0 = 0; local_2d0 < local_2c8; local_2d0 = local_2d0 + 1) {
    local_290 = &local_320;
    local_13c = *(int *)((long)local_2a8 + 0x2c);
    local_140 = (int)local_2a8[6];
    local_144 = *(undefined4 *)((long)local_2a8 + 0x34);
    local_2d8 = (float *)(*local_2a8 + local_2a8[8] * (long)local_2d0 * local_2a8[2]);
    local_158 = local_2a8[2];
    local_15c = (undefined4)local_2a8[3];
    local_168 = local_2a8[4];
    local_138 = &local_320;
    local_128 = (long)local_13c * (long)local_140 * local_158;
    local_288 = &local_320;
    local_278 = &local_320;
    local_248 = &local_380;
    local_174 = *(int *)((long)local_2b8 + 0x2c);
    local_178 = (int)local_2b8[6];
    local_17c = *(undefined4 *)((long)local_2b8 + 0x34);
    local_338 = (float *)(*local_2b8 + local_2b8[8] * (long)local_2d0 * local_2b8[2]);
    local_190 = local_2b8[2];
    local_194 = (undefined4)local_2b8[3];
    local_1a0 = local_2b8[4];
    local_170 = &local_380;
    local_118 = (long)local_174 * (long)local_178 * local_190;
    local_238 = &local_380;
    this = (binary_op_add *)&local_380;
    local_2e8 = 0;
    local_2ec = 0;
    local_2f0 = 0;
    local_2f4 = 0;
    local_308 = 0;
    local_310 = 0;
    local_318 = 0;
    local_320 = 0;
    local_11c = 0x10;
    local_12c = 0x10;
    local_254 = local_2d0;
    local_255 = 1;
    local_29c = local_2d0;
    local_29d = 1;
    local_2e0 = 0;
    local_2f8 = 0;
    local_380 = 0;
    local_370 = 0;
    local_368 = 0;
    local_358 = 0;
    local_354 = 0;
    local_350 = 0;
    local_34c = 0;
    local_348 = 0;
    local_340 = 0;
    local_378 = 0;
    local_384 = 0;
    local_22c = local_2ac;
    local_34 = local_2ac;
    local_38 = local_2ac;
    local_3c = local_2ac;
    local_40 = local_2ac;
    local_44 = local_2ac;
    local_48 = local_2ac;
    local_4c = local_2ac;
    local_50 = local_2ac;
    auVar1 = vinsertps_avx(ZEXT416((uint)local_2ac),ZEXT416((uint)local_2ac),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_2ac),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_2ac),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)local_2ac),ZEXT416((uint)local_2ac),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2ac),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2ac),0x30);
    auVar4._16_16_ = auVar1;
    auVar4._0_16_ = auVar2;
    local_80._0_8_ = auVar2._0_8_;
    local_80._8_8_ = auVar2._8_8_;
    local_80._16_8_ = auVar1._0_8_;
    local_80._24_8_ = auVar1._8_8_;
    local_3c0 = local_80._0_8_;
    uStack_3b8 = local_80._8_8_;
    uStack_3b0 = local_80._16_8_;
    uStack_3a8 = local_80._24_8_;
    fVar3 = local_2ac;
    local_268 = this;
    local_188 = local_338;
    local_150 = local_2d8;
    local_e8 = this;
    local_c8 = local_278;
    local_80 = auVar4;
    local_360 = local_1a0;
    local_300 = local_168;
    for (; local_384 + 7 < local_2cc; local_384 = local_384 + 8) {
      local_228 = local_2d8;
      uVar6 = *(undefined8 *)local_2d8;
      uVar5 = *(undefined8 *)(local_2d8 + 2);
      uVar7 = *(undefined8 *)(local_2d8 + 4);
      uVar8 = *(undefined8 *)(local_2d8 + 6);
      local_3e0 = uVar6;
      uStack_3d8 = uVar5;
      uStack_3d0 = uVar7;
      uStack_3c8 = uVar8;
      BinaryOp_x86_fma_functor::binary_op_add::func_pack8
                (this,(__m256 *)CONCAT44(fVar3,in_stack_fffffffffffffba8),in_stack_fffffffffffffba0)
      ;
      local_1e8 = local_338;
      *(undefined8 *)local_338 = uVar6;
      *(undefined8 *)(local_338 + 2) = uVar5;
      *(undefined8 *)(local_338 + 4) = uVar7;
      *(undefined8 *)(local_338 + 6) = uVar8;
      local_2d8 = local_2d8 + 8;
      local_338 = local_338 + 8;
      local_3e0 = uVar6;
      uStack_3d8 = uVar5;
      uStack_3d0 = uVar7;
      uStack_3c8 = uVar8;
      local_220 = uVar6;
      uStack_218 = uVar5;
      uStack_210 = uVar7;
      uStack_208 = uVar8;
    }
    local_1cc = local_2ac;
    local_1e0 = local_2ac;
    fStack_1dc = local_2ac;
    fStack_1d8 = local_2ac;
    fStack_1d4 = local_2ac;
    for (; local_384 + 3 < local_2cc; local_384 = local_384 + 4) {
      local_1c8 = local_2d8;
      local_400 = *(float (*) [2])local_2d8;
      uVar6 = *(undefined8 *)(local_2d8 + 2);
      afStack_3f8 = (float  [2])uVar6;
      afVar9 = BinaryOp_x86_fma_functor::binary_op_add::func_pack4
                         (local_2c1,(__m128 *)local_400,&local_3f0);
      local_400 = afVar9._0_8_;
      local_1a8 = local_338;
      *(float (*) [2])local_338 = local_400;
      *(undefined8 *)(local_338 + 2) = uVar6;
      local_2d8 = local_2d8 + 4;
      local_338 = local_338 + 4;
      afStack_3f8 = (float  [2])uVar6;
      local_1c0 = local_400;
      afStack_1b8._0_8_ = uVar6;
    }
    for (; local_384 < local_2cc; local_384 = local_384 + 1) {
      fVar3 = BinaryOp_x86_fma_functor::binary_op_add::func(local_2c1,local_2d8,&local_2ac);
      *local_338 = fVar3;
      local_2d8 = local_2d8 + 1;
      local_338 = local_338 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar(const Mat& a, float b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps(b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b);
            ptr++;
            outptr++;
        }
    }

    return 0;
}